

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_decoder.cpp
# Opt level: O3

String * __thiscall
LLVMBC::BlockOrRecord::getString_abi_cxx11_
          (String *__return_storage_ptr__,BlockOrRecord *this,size_t startOffset)

{
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  resize(__return_storage_ptr__,
         ((long)(this->ops).
                super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ops).
                super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) - startOffset,'\0');
  if (__return_storage_ptr__->_M_string_length != 0) {
    uVar1 = 0;
    do {
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar1] =
           (char)(this->ops).
                 super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[startOffset + uVar1];
      uVar1 = uVar1 + 1;
    } while (uVar1 < __return_storage_ptr__->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

dxil_spv::String BlockOrRecord::getString(size_t startOffset) const
{
  dxil_spv::String ret;
  ret.resize(ops.size() - startOffset);
  for(size_t i = 0; i < ret.size(); i++)
    ret[i] = (char)ops[i + startOffset];
  return ret;
}